

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::CopyImage::SmokeTest::iterate(SmokeTest *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  GLuint GVar5;
  IterateResult IVar6;
  undefined4 extraout_var;
  SmokeTest *this_00;
  GLubyte *src_pixels;
  testCase *test_case;
  GLubyte *pGVar8;
  GLuint ignored;
  testCase desc;
  GLubyte *local_1c0;
  GLubyte *local_1b8;
  GLuint local_1ac;
  undefined1 local_1a8 [8];
  _func_int **pp_Stack_1a0;
  ios_base local_130 [264];
  long lVar7;
  
  local_1b8 = (GLubyte *)0x0;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_1c0 = (GLubyte *)0x0;
  test_case = (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_test_case_index;
  (**(code **)(lVar7 + 0xff0))(0xd05,1);
  (**(code **)(lVar7 + 0xff0))(0xcf5,1);
  uVar4 = (**(code **)(lVar7 + 0x800))();
  this_00 = (SmokeTest *)(ulong)uVar4;
  glu::checkError(uVar4,"PixelStorei",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfbc);
  prepareDstPxls(this_00,test_case,&local_1b8);
  prepareSrcPxls(this_00,test_case,&local_1c0);
  pGVar8 = local_1b8;
  if (test_case->m_target == 0x8d41) {
    uVar1 = test_case->m_internal_format;
    pp_Stack_1a0 = *(_func_int ***)&test_case->m_format;
    local_1ac = 0;
    local_1a8._4_4_ = uVar1;
    local_1a8._0_4_ = 0xde1;
    GVar5 = prepareTexture(this,test_case,(GLubyte *)0x0,&local_1ac);
    pGVar8 = local_1b8;
    this->m_rb_name = GVar5;
    GVar5 = prepareTexture(this,(testCase *)local_1a8,local_1b8,&this->m_dst_buf_name);
    src_pixels = local_1c0;
    this->m_dst_tex_name = GVar5;
    GVar5 = prepareTexture(this,(testCase *)local_1a8,local_1c0,&this->m_src_buf_name);
  }
  else {
    GVar5 = prepareTexture(this,test_case,local_1b8,&this->m_dst_buf_name);
    src_pixels = local_1c0;
    this->m_dst_tex_name = GVar5;
    GVar5 = prepareTexture(this,test_case,local_1c0,&this->m_src_buf_name);
  }
  this->m_src_tex_name = GVar5;
  bVar2 = copyAndVerify(this,test_case,src_pixels);
  clean(this);
  if (pGVar8 != (GLubyte *)0x0) {
    operator_delete__(pGVar8);
  }
  if (src_pixels != (GLubyte *)0x0) {
    operator_delete__(src_pixels);
  }
  if (bVar2) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar4 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar4;
    IVar6 = (IterateResult)
            ((ulong)uVar4 <
            (ulong)((long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  else {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a0,"Failure. ",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a0);
    std::ios_base::~ios_base(local_130);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar6 = STOP;
  }
  return IVar6;
}

Assistant:

tcu::TestNode::IterateResult SmokeTest::iterate()
{
	GLubyte*					 dst_pixels = 0;
	const Functions&			 gl			= m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result  = tcu::TestNode::STOP;
	bool						 result		= false;
	GLubyte*					 src_pixels = 0;
	const testCase&				 test_case  = m_test_cases[m_test_case_index];

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PixelStorei");

	try
	{
		/* Prepare pixels */
		prepareDstPxls(test_case, dst_pixels);
		prepareSrcPxls(test_case, src_pixels);

		/* Prepare textures */
		if (GL_RENDERBUFFER == test_case.m_target)
		{
			testCase desc	= test_case;
			GLuint   ignored = 0;

			desc.m_target = GL_TEXTURE_2D;

			m_rb_name	  = prepareTexture(test_case, 0 /* pixels */, ignored /* buffer name */);
			m_dst_tex_name = prepareTexture(desc, dst_pixels, m_dst_buf_name);
			m_src_tex_name = prepareTexture(desc, src_pixels, m_src_buf_name);
		}
		else
		{
			m_dst_tex_name = prepareTexture(test_case, dst_pixels, m_dst_buf_name);
			m_src_tex_name = prepareTexture(test_case, src_pixels, m_src_buf_name);
		}

		/* Copy images and verify results */
		result = copyAndVerify(test_case, src_pixels);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		cleanPixels(dst_pixels);
		cleanPixels(src_pixels);
		throw exc;
	}

	/* Free resources */
	clean();
	cleanPixels(dst_pixels);
	cleanPixels(src_pixels);

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failure. " << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}